

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O1

int replace_pattr(attr_list list,atom_t attr_id,attr_value_type val_type,attr_union value)

{
  byte bVar1;
  int_attr_struct *piVar2;
  attr_p paVar3;
  ulong uVar4;
  long lVar5;
  
  if (list->list_of_lists != 0) {
    __assert_fail("list->list_of_lists == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/atl/atl/attr.c"
                  ,0x301,"int replace_pattr(attr_list, atom_t, attr_value_type, attr_union)");
  }
  if (val_type == Attr_Int4) {
    piVar2 = (list->l).list.iattrs;
    if ((ulong)piVar2->int_attr_count != 0) {
      uVar4 = 0;
      do {
        if (piVar2->iattr[uVar4].attr_id == attr_id) {
          piVar2->iattr[uVar4].value = (int4)value.u.f;
          return 1;
        }
        uVar4 = uVar4 + 1;
      } while (piVar2->int_attr_count != uVar4);
    }
  }
  else {
    bVar1 = ((list->l).list.iattrs)->other_attr_count;
    if (bVar1 != 0) {
      paVar3 = (list->l).list.attributes;
      lVar5 = 0;
      do {
        if (*(int *)((long)&paVar3->attr_id + lVar5) == attr_id) {
          *(attr_value_type *)((long)&paVar3->val_type + lVar5) = val_type;
          paVar3 = (list->l).list.attributes;
          *(double *)((long)&(paVar3->value).u + lVar5) = value.u.d;
          *(long *)((long)&(paVar3->value).u + lVar5 + 8) = value.u._8_8_;
          return 1;
        }
        lVar5 = lVar5 + 0x18;
      } while ((ulong)bVar1 * 0x18 != lVar5);
    }
  }
  return 0;
}

Assistant:

extern int
replace_pattr(attr_list list, atom_t attr_id, attr_value_type val_type, attr_union value)
{
    int index = 0;
    assert(list->list_of_lists == 0);
    if (val_type == Attr_Int4) {
	while (index < list->l.list.iattrs->int_attr_count) {
	    if (list->l.list.iattrs->iattr[index].attr_id == attr_id) {
		list->l.list.iattrs->iattr[index].value = (int4)(long)value.u.i;
		return 1;
	    }
	    index++;
	}
    } else {
	while (index < list->l.list.iattrs->other_attr_count) {
	    if (list->l.list.attributes[index].attr_id == attr_id) {
		list->l.list.attributes[index].val_type = val_type;
		list->l.list.attributes[index].value = value;
		return 1;
	    }
	    index++;
	}
    }
    return 0;  
}